

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

void __thiscall google::protobuf::io::StringOutputStream::BackUp(StringOutputStream *this,int count)

{
  char *failure_msg;
  int line;
  LogMessageFatal local_30;
  size_type local_20;
  
  failure_msg = absl::lts_20250127::log_internal::Check_GEImpl(count,0,"count >= 0");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    if (this->target_ == (string *)0x0) {
      failure_msg = "target_ != nullptr";
      line = 0xa0;
    }
    else {
      local_30.super_LogMessage._0_8_ = SEXT48(count);
      local_20 = this->target_->_M_string_length;
      failure_msg = absl::lts_20250127::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                              ((unsigned_long *)&local_30,&local_20,
                               "static_cast<size_t>(count) <= target_->size()");
      if (failure_msg == (Nullable<const_char_*>)0x0) {
        std::__cxx11::string::resize((ulong)this->target_);
        return;
      }
      line = 0xa1;
    }
  }
  else {
    line = 0x9f;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
}

Assistant:

void StringOutputStream::BackUp(int count) {
  ABSL_CHECK_GE(count, 0);
  ABSL_CHECK(target_ != nullptr);
  ABSL_CHECK_LE(static_cast<size_t>(count), target_->size());
  target_->resize(target_->size() - count);
}